

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O3

int NULLC::StrNEqual(NULLCArray a,NULLCArray b)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar4 = a.len;
  uVar2 = 1;
  if (uVar4 == b.len) {
    if (uVar4 == 0) {
      return 0;
    }
    if (*a.ptr == *b.ptr) {
      uVar1 = 1;
      do {
        uVar3 = uVar1;
        if (uVar4 == uVar3) break;
        uVar1 = uVar3 + 1;
      } while (a.ptr[uVar3] == b.ptr[uVar3]);
      uVar2 = (uint)(uVar3 < uVar4);
    }
  }
  return uVar2;
}

Assistant:

int NULLC::StrNEqual(NULLCArray a, NULLCArray b)
{
	return !StrEqual(a, b);
}